

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

void __thiscall
google::protobuf::util::Status::Status(Status *this,Code error_code,StringPiece error_message)

{
  int in_ESI;
  int *in_RDI;
  string local_40 [24];
  StringPiece *in_stack_ffffffffffffffd8;
  
  *in_RDI = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  if (in_ESI != 0) {
    StringPiece::ToString_abi_cxx11_(in_stack_ffffffffffffffd8);
    std::__cxx11::string::operator=((string *)(in_RDI + 2),local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

Status::Status(error::Code error_code, StringPiece error_message)
    : error_code_(error_code) {
  if (error_code != error::OK) {
    error_message_ = error_message.ToString();
  }
}